

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunmatrix_sparse.c
# Opt level: O1

SUNErrCode SUNMatScaleAddI_Sparse(sunrealtype c,SUNMatrix A)

{
  long *plVar1;
  void *pvVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  bool bVar12;
  double dVar13;
  
  pvVar2 = A->content;
  bVar12 = *(int *)((long)pvVar2 + 0x28) == 0;
  lVar10 = *(long *)((long)pvVar2 + (ulong)bVar12 * 8);
  lVar3 = *(long *)((long)pvVar2 + (ulong)!bVar12 * 8);
  lVar4 = *(long *)((long)pvVar2 + 0x38);
  lVar5 = *(long *)((long)pvVar2 + 0x20);
  lVar6 = *(long *)((long)pvVar2 + 0x30);
  if (lVar10 < 1) {
    lVar9 = 0;
  }
  else {
    lVar9 = 0;
    lVar7 = 0;
    do {
      lVar8 = *(long *)(lVar4 + lVar7 * 8);
      lVar11 = *(long *)(lVar4 + 8 + lVar7 * 8);
      bVar12 = true;
      if (lVar8 < lVar11) {
        bVar12 = false;
        do {
          dVar13 = *(double *)(lVar5 + lVar8 * 8) * c;
          if (*(long *)(lVar6 + lVar8 * 8) == lVar7) {
            bVar12 = true;
            dVar13 = dVar13 + 1.0;
          }
          *(double *)(lVar5 + lVar8 * 8) = dVar13;
          lVar8 = lVar8 + 1;
        } while (lVar11 != lVar8);
        bVar12 = !bVar12;
      }
      lVar8 = lVar7 + 1;
      lVar9 = lVar9 + (ulong)(byte)(lVar7 < lVar3 & bVar12);
      lVar7 = lVar8;
    } while (lVar8 != lVar10);
  }
  lVar7 = *(long *)(lVar4 + lVar10 * 8) + lVar9;
  if (*(long *)((long)pvVar2 + 0x10) < lVar7) {
    SUNSparseMatrix_Reallocate(A,lVar7);
    pvVar2 = A->content;
    lVar4 = *(long *)((long)pvVar2 + 0x38);
    lVar5 = *(long *)((long)pvVar2 + 0x20);
    lVar6 = *(long *)((long)pvVar2 + 0x30);
  }
  if (0 < lVar9) {
    do {
      lVar11 = lVar10 + -1;
      lVar8 = *(long *)(lVar4 + -8 + lVar10 * 8);
      lVar7 = *(long *)(lVar4 + lVar10 * 8);
      bVar12 = false;
      if (lVar8 < lVar7) {
        do {
          lVar8 = *(long *)(lVar6 + -8 + lVar7 * 8);
          if (lVar8 == lVar11) {
            bVar12 = true;
          }
          *(long *)(lVar6 + -8 + lVar9 * 8 + lVar7 * 8) = lVar8;
          *(undefined8 *)(lVar5 + -8 + lVar9 * 8 + lVar7 * 8) =
               *(undefined8 *)(lVar5 + -8 + lVar7 * 8);
          lVar7 = lVar7 + -1;
          lVar8 = *(long *)(lVar4 + lVar11 * 8);
        } while (lVar8 < lVar7);
      }
      plVar1 = (long *)(lVar4 + lVar10 * 8);
      *plVar1 = *plVar1 + lVar9;
      if ((!bVar12) && (lVar10 <= lVar3)) {
        lVar8 = lVar8 + lVar9;
        lVar9 = lVar9 + -1;
        *(long *)(lVar6 + (lVar8 + -1) * 8) = lVar11;
        *(undefined8 *)(lVar5 + (*(long *)(lVar4 + lVar11 * 8) + lVar9) * 8) = 0x3ff0000000000000;
      }
      lVar10 = lVar11;
    } while (0 < lVar9);
  }
  return 0;
}

Assistant:

SUNErrCode SUNMatScaleAddI_Sparse(sunrealtype c, SUNMatrix A)
{
  SUNFunctionBegin(A->sunctx);
  const sunindextype N = SM_SPARSETYPE_S(A) == CSC_MAT ? SM_COLUMNS_S(A)
                                                       : SM_ROWS_S(A);
  const sunindextype M = SM_SPARSETYPE_S(A) == CSC_MAT ? SM_ROWS_S(A)
                                                       : SM_COLUMNS_S(A);

  sunindextype* Ap = SM_INDEXPTRS_S(A);
  SUNAssert(Ap, SUN_ERR_ARG_CORRUPT);
  sunindextype* Ai = SM_INDEXVALS_S(A);
  SUNAssert(Ai, SUN_ERR_ARG_CORRUPT);
  sunrealtype* Ax = SM_DATA_S(A);
  SUNAssert(Ax, SUN_ERR_ARG_CORRUPT);

  sunindextype newvals = 0;
  for (sunindextype j = 0; j < N; j++)
  {
    /* scan column (row if CSR) of A, searching for diagonal value */
    sunbooleantype found = SUNFALSE;
    for (sunindextype i = Ap[j]; i < Ap[j + 1]; i++)
    {
      if (Ai[i] == j)
      {
        found = SUNTRUE;
        Ax[i] = ONE + c * Ax[i];
      }
      else { Ax[i] *= c; }
    }
    /* If no diagonal element found and the current column (row) can actually
     * contain a diagonal element, increment the storage counter */
    if (!found && j < M) { newvals++; }
  }

  /* At this point, A has the correctly updated values except for any new
   * diagonal elements that need to be added (of which there are newvals). Now,
   * we allocate additional storage if needed */
  const sunindextype new_nnz = Ap[N] + newvals;
  if (new_nnz > SM_NNZ_S(A))
  {
    SUNCheckCall(SUNSparseMatrix_Reallocate(A, new_nnz));
    Ap = SM_INDEXPTRS_S(A);
    Ai = SM_INDEXVALS_S(A);
    Ax = SM_DATA_S(A);
  }

  for (sunindextype j = N - 1; newvals > 0; j--)
  {
    sunbooleantype found = SUNFALSE;
    for (sunindextype i = Ap[j + 1] - 1; i >= Ap[j]; i--)
    {
      if (Ai[i] == j) { found = SUNTRUE; }

      /* Shift elements to make room for diagonal elements */
      Ai[i + newvals] = Ai[i];
      Ax[i + newvals] = Ax[i];
    }

    Ap[j + 1] += newvals;
    if (!found && j < M)
    {
      /* This column (row) needs a diagonal element added */
      newvals--;
      Ai[Ap[j] + newvals] = j;
      Ax[Ap[j] + newvals] = ONE;
    }
  }

  return SUN_SUCCESS;
}